

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O3

void __thiscall
vector_bagwell<unsigned_long,_16U>::~vector_bagwell(vector_bagwell<unsigned_long,_16U> *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  pointer ppuVar4;
  
  ppuVar4 = (this->_index_block).
            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_index_block).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppuVar4) {
    uVar2 = 0;
    uVar3 = 1;
    do {
      free(ppuVar4[uVar2]);
      ppuVar4 = (this->_index_block).
                super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar1 = uVar3 < (ulong)((long)(this->_index_block).
                                    super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar4 >> 3)
      ;
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  if (ppuVar4 != (pointer)0x0) {
    operator_delete(ppuVar4);
    return;
  }
  return;
}

Assistant:

~vector_bagwell()
	{
		for (unsigned i=0; i < _index_block.size(); ++i)
			free(_index_block[i]);
	}